

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_0000_0999.cpp
# Opt level: O0

void __thiscall psy::C::DeclarationBinderTester::case0164(DeclarationBinderTester *this)

{
  Expectation *pEVar1;
  Decl *pDVar2;
  Ty *this_00;
  socklen_t __len;
  allocator<char> local_591;
  string local_590;
  allocator<char> local_569;
  string local_568;
  Decl local_548;
  Decl local_480;
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  Decl local_368;
  Decl local_2a0;
  string local_1d8;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30 [32];
  DeclarationBinderTester *local_10;
  DeclarationBinderTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_30,"x ( y z ) { }",&local_31);
  Expectation::Expectation(&local_1b8);
  std::__cxx11::string::string
            ((string *)&local_1d8,
             (string *)
             &DeclarationBinder::DiagnosticsReporter::
              ID_of_TypeSpecifierMissingDefaultsToInt_abi_cxx11_);
  pEVar1 = Expectation::diagnostic(&local_1b8,Error,&local_1d8);
  Decl::Decl(&local_368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"x",&local_389);
  pDVar2 = Decl::Function(&local_368,&local_388,File);
  pDVar2 = Ty::Basic(&pDVar2->ty_,Int_S,None);
  pDVar2 = Ty::Derived(&pDVar2->ty_,Function,None,None);
  this_00 = Ty::addParam(&pDVar2->ty_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"y",&local_3b1);
  pDVar2 = Ty::Typedef(this_00,&local_3b0,None);
  Decl::Decl(&local_2a0,pDVar2);
  pEVar1 = Expectation::declaration(pEVar1,&local_2a0);
  Decl::Decl(&local_548);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_568,"z",&local_569);
  __len = 3;
  pDVar2 = Decl::Object(&local_548,&local_568,ParameterDeclaration,Block);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_590,"y",&local_591);
  pDVar2 = Ty::Typedef(&pDVar2->ty_,&local_590,None);
  Decl::Decl(&local_480,pDVar2);
  pEVar1 = Expectation::declaration(pEVar1,&local_480);
  Expectation::Expectation(&local_100,pEVar1);
  bind(this,(int)local_30,(sockaddr *)&local_100,__len);
  Expectation::~Expectation(&local_100);
  Decl::~Decl(&local_480);
  std::__cxx11::string::~string((string *)&local_590);
  std::allocator<char>::~allocator(&local_591);
  std::__cxx11::string::~string((string *)&local_568);
  std::allocator<char>::~allocator(&local_569);
  Decl::~Decl(&local_548);
  Decl::~Decl(&local_2a0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  Decl::~Decl(&local_368);
  std::__cxx11::string::~string((string *)&local_1d8);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void DeclarationBinderTester::case0164()
{
    bind("x ( y z ) { }",
         Expectation()
             .diagnostic(Expectation::ErrorOrWarn::Error,
                         DeclarationBinder::DiagnosticsReporter::ID_of_TypeSpecifierMissingDefaultsToInt)
             .declaration(Decl()
                      .Function("x", ScopeKind::File)
                      .ty_.Basic(BasicTypeKind::Int_S)
                      .ty_.Derived(TypeKind::Function)
                      .ty_.addParam().Typedef("y"))
             .declaration(Decl()
                      .Object("z", SymbolKind::ParameterDeclaration, ScopeKind::Block)
                      .ty_.Typedef("y")));
}